

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::back_up_to_top(Proof *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"# ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,'\n');
  ((this->_imp)._M_t.
   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>.
   _M_t.
   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->active_level = 0;
  return;
}

Assistant:

auto Proof::back_up_to_top() -> void
{
    *_imp->proof_stream << "# " << 0 << '\n';
    _imp->active_level = 0;
}